

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  mapped_type *pmVar6;
  uint uVar7;
  _Base_ptr p_Var8;
  uint uVar9;
  _Base_ptr p_Var10;
  ulong __n;
  int iVar11;
  bool bVar12;
  char *__s;
  char *pcVar13;
  Video *media;
  Video *local_38;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  __s = __return_storage_ptr__->data + 1;
  memset(__s,0x1b,0x3ff);
  __n = (tex->relativeFileName)._M_string_length;
  if (__n < 0x400) {
    __return_storage_ptr__->length = (ai_uint32)__n;
    memcpy(__return_storage_ptr__->data,(tex->relativeFileName)._M_dataplus._M_p,__n);
    __return_storage_ptr__->data[__n] = '\0';
  }
  local_38 = tex->media;
  if (local_38 == (Video *)0x0) {
    return __return_storage_ptr__;
  }
  p_Var1 = &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  for (; p_Var10 != (_Base_ptr)0x0;
      p_Var10 = (&p_Var10->_M_left)[*(Video **)(p_Var10 + 1) < local_38]) {
    if (*(Video **)(p_Var10 + 1) >= local_38) {
      p_Var8 = p_Var10;
    }
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
     (p_Var10 = p_Var8, local_38 < *(Video **)(p_Var8 + 1))) {
    p_Var10 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var10 == p_Var1) {
    if (local_38->contentLength == 0) {
      bVar12 = false;
      goto LAB_0017b58e;
    }
    uVar7 = ConvertVideo(this,local_38);
    pmVar6 = std::
             map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
             ::operator[](&this->textures_converted,&local_38);
    *pmVar6 = uVar7;
  }
  else {
    uVar7 = *(uint *)&p_Var10[1]._M_parent;
  }
  __n = (ulong)uVar7;
  bVar12 = true;
LAB_0017b58e:
  if ((bVar12) && (this->doc->settings->useLegacyEmbeddedTextureNaming != false)) {
    __return_storage_ptr__->data[0] = '*';
    uVar7 = 1;
    if ((int)__n < 0) {
      __s = __return_storage_ptr__->data + 2;
      __return_storage_ptr__->data[1] = '-';
      __n = (ulong)(uint)-(int)__n;
      uVar7 = 2;
    }
    iVar11 = 1000000000;
    bVar12 = false;
    do {
      pcVar13 = __s;
      if (0x3fe < uVar7) break;
      uVar2 = (ulong)(uint)((int)(uint)__n >> 0x1f) << 0x20 | __n & 0xffffffff;
      lVar3 = (long)uVar2 / (long)iVar11;
      uVar9 = (uint)((long)uVar2 % (long)iVar11);
      if (((bVar12) || (iVar11 == 1)) || (uVar5 = (uint)__n, (int)lVar3 != 0)) {
        pcVar13 = __s + 1;
        uVar7 = uVar7 + 1;
        *__s = (char)lVar3 + '0';
        bVar12 = true;
        __s = pcVar13;
        uVar5 = uVar9;
        if (iVar11 != 1) goto LAB_0017b60d;
        bVar4 = false;
        iVar11 = 1;
      }
      else {
LAB_0017b60d:
        uVar9 = uVar5;
        iVar11 = iVar11 / 10;
        bVar4 = true;
        pcVar13 = __s;
      }
      __n = (ulong)uVar9;
      __s = pcVar13;
    } while (bVar4);
    *pcVar13 = '\0';
    __return_storage_ptr__->length = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }